

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                   *this,size_t new_capacity)

{
  ctrl_t *__s;
  ulong uVar1;
  Layout LVar2;
  
  if (new_capacity == 0) {
    __assert_fail("new_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8b8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                 );
  }
  LVar2 = MakeLayout(new_capacity);
  uVar1 = LVar2.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<cs_impl::any,_cs::statement_block_*>_>
          .size_[0] + 7 & 0xfffffffffffffff8;
  __s = (ctrl_t *)
        Allocate<8ul,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                  ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                   &this->settings_,
                   LVar2.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<cs_impl::any,_cs::statement_block_*>_>
                   .size_[1] * 0x10 + uVar1);
  if (((ulong)__s & 7) == 0) {
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar1);
    memset(__s,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                ,0x1074,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, phmap::priv::map_slot_type<cs_impl::any, cs::statement_block *>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::priv::map_slot_type<cs_impl::any, cs::statement_block *>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity)
			{
				assert(new_capacity);
				if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value &&
				        slots_ == nullptr) {
					infoz_ = Sample();
				}

				auto layout = MakeLayout(new_capacity);
				char* mem = static_cast<char*>(
				                Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
				ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
				slots_ = layout.template Pointer<1>(mem);
				reset_ctrl(new_capacity);
				reset_growth_left(new_capacity);
				infoz_.RecordStorageChanged(size_, new_capacity);
			}